

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

void __thiscall DCanvas::CalcGamma(DCanvas *this,float gamma,BYTE *gammalookup)

{
  double dVar1;
  int local_2c;
  int i;
  double invgamma;
  BYTE *gammalookup_local;
  float gamma_local;
  DCanvas *this_local;
  
  for (local_2c = 0; local_2c < 0x100; local_2c = local_2c + 1) {
    dVar1 = pow((double)local_2c / 255.0,(double)(1.0 / gamma));
    gammalookup[local_2c] = (BYTE)(int)(dVar1 * 255.0);
  }
  return;
}

Assistant:

void DCanvas::CalcGamma (float gamma, BYTE gammalookup[256])
{
	// I found this formula on the web at
	// <http://panda.mostang.com/sane/sane-gamma.html>,
	// but that page no longer exits.

	double invgamma = 1.f / gamma;
	int i;

	for (i = 0; i < 256; i++)
	{
		gammalookup[i] = (BYTE)(255.0 * pow (i / 255.0, invgamma));
	}
}